

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayremove(HSQUIRRELVM v,SQInteger idx,SQInteger itemidx)

{
  bool bVar1;
  SQInteger SVar2;
  HSQUIRRELVM in_RDI;
  SQInteger unaff_retaddr;
  HSQUIRRELVM in_stack_00000008;
  SQObjectPtr *arr;
  SQChar *in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  SQArray *in_stack_ffffffffffffffd8;
  undefined8 in_stack_fffffffffffffff8;
  SQObjectType type;
  SQRESULT SVar3;
  
  type = (SQObjectType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  SVar2 = sq_gettop(in_RDI);
  if (SVar2 < 1) {
    SQVM::Raise_Error(in_RDI,"not enough params in the stack");
    SVar3 = -1;
  }
  else {
    bVar1 = sq_aux_gettypedarg(in_stack_00000008,unaff_retaddr,type,(SQObjectPtr **)in_RDI);
    if (bVar1) {
      bVar1 = SQArray::Remove(in_stack_ffffffffffffffd8,(SQInteger)in_stack_ffffffffffffffd0);
      if (bVar1) {
        SVar3 = 0;
      }
      else {
        SVar3 = sq_throwerror(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
    }
    else {
      SVar3 = -1;
    }
  }
  return SVar3;
}

Assistant:

SQRESULT sq_arrayremove(HSQUIRRELVM v,SQInteger idx,SQInteger itemidx)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    return _array(*arr)->Remove(itemidx) ? SQ_OK : sq_throwerror(v,_SC("index out of range"));
}